

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeIndirectComputeDispatchTests.cpp
# Opt level: O2

void __thiscall
vkt::compute::anon_unknown_1::IndirectDispatchCaseBufferUpload::initPrograms
          (IndirectDispatchCaseBufferUpload *this,SourceCollections *programCollection)

{
  char *pcVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  ProgramSources *this_00;
  string verifyProgramString;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  ostringstream verifyBuffer;
  key_type local_250;
  undefined1 local_230 [40];
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  ostringstream local_198 [376];
  
  pcVar1 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = std::operator<<((ostream *)local_198,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,
                           "layout(local_size_x = ${LOCAL_SIZE_X}, local_size_y = ${LOCAL_SIZE_Y}, local_size_z = ${LOCAL_SIZE_Z}) in;\n"
                          );
  poVar2 = std::operator<<(poVar2,"layout(set = 0, binding = 0, std430) buffer Result\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"    uvec3           expectedGroupCount;\n");
  poVar2 = std::operator<<(poVar2,"    coherent uint   numPassed;\n");
  poVar2 = std::operator<<(poVar2,"} result;\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,
                           "    if (all(equal(result.expectedGroupCount, gl_NumWorkGroups)))\n");
  poVar2 = std::operator<<(poVar2,"        atomicAdd(result.numPassed, 1u);\n");
  std::operator<<(poVar2,"}\n");
  local_1c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1c8._M_impl.super__Rb_tree_header._M_header;
  local_1c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_208._M_dataplus._M_p._0_4_ = (this->m_workGroupSize).m_data[0];
  local_1c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1c8._M_impl.super__Rb_tree_header._M_header._M_left;
  de::toString<unsigned_int>((string *)local_230,(uint *)&local_208);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"LOCAL_SIZE_X",(allocator<char> *)&local_1e8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1c8,&local_250);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)local_230);
  local_208._M_dataplus._M_p._0_4_ = (this->m_workGroupSize).m_data[1];
  de::toString<unsigned_int>((string *)local_230,(uint *)&local_208);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"LOCAL_SIZE_Y",(allocator<char> *)&local_1e8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1c8,&local_250);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)local_230);
  local_208._M_dataplus._M_p._0_4_ = (this->m_workGroupSize).m_data[2];
  de::toString<unsigned_int>((string *)local_230,(uint *)&local_208);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"LOCAL_SIZE_Z",(allocator<char> *)&local_1e8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1c8,&local_250);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)local_230);
  std::__cxx11::stringbuf::str();
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_230,&local_208);
  tcu::StringTemplate::specialize
            (&local_250,(StringTemplate *)local_230,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_1c8);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_230);
  std::__cxx11::string::~string((string *)&local_208);
  std::operator+(&local_1e8,"indirect_dispatch_",
                 &(this->super_TestCase).super_TestCase.super_TestNode.m_name);
  std::operator+(&local_208,&local_1e8,"_verify");
  this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&programCollection->glslSources,&local_208);
  glu::ComputeSource::ComputeSource((ComputeSource *)local_230,&local_250);
  glu::ProgramSources::operator<<(this_00,(ShaderSource *)local_230);
  std::__cxx11::string::~string((string *)(local_230 + 8));
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_250);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void IndirectDispatchCaseBufferUpload::initPrograms (vk::SourceCollections& programCollection) const
{
	const char* const	versionDecl = glu::getGLSLVersionDeclaration(m_glslVersion);

	std::ostringstream	verifyBuffer;

	verifyBuffer
		<< versionDecl << "\n"
		<< "layout(local_size_x = ${LOCAL_SIZE_X}, local_size_y = ${LOCAL_SIZE_Y}, local_size_z = ${LOCAL_SIZE_Z}) in;\n"
		<< "layout(set = 0, binding = 0, std430) buffer Result\n"
		<< "{\n"
		<< "    uvec3           expectedGroupCount;\n"
		<< "    coherent uint   numPassed;\n"
		<< "} result;\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "    if (all(equal(result.expectedGroupCount, gl_NumWorkGroups)))\n"
		<< "        atomicAdd(result.numPassed, 1u);\n"
		<< "}\n";

	std::map<std::string, std::string> args;

	args["LOCAL_SIZE_X"] = de::toString(m_workGroupSize.x());
	args["LOCAL_SIZE_Y"] = de::toString(m_workGroupSize.y());
	args["LOCAL_SIZE_Z"] = de::toString(m_workGroupSize.z());

	std::string verifyProgramString = tcu::StringTemplate(verifyBuffer.str()).specialize(args);

	programCollection.glslSources.add("indirect_dispatch_" + m_name + "_verify") << glu::ComputeSource(verifyProgramString);
}